

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O0

Vec_Int_t * Gia_ManCreateMap(Gia_Man_t *p,Vec_Int_t *vFadds)

{
  int iVar1;
  Vec_Int_t *p_00;
  undefined4 local_24;
  int i;
  Vec_Int_t *vMap;
  Vec_Int_t *vFadds_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Vec_IntStartFull(iVar1);
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vFadds);
    if (iVar1 / 5 <= local_24) break;
    iVar1 = Vec_IntEntry(vFadds,local_24 * 5 + 4);
    Vec_IntWriteEntry(p_00,iVar1,local_24);
    local_24 = local_24 + 1;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManCreateMap( Gia_Man_t * p, Vec_Int_t * vFadds )
{
    Vec_Int_t * vMap = Vec_IntStartFull( Gia_ManObjNum(p) );  int i;
    Dtc_ForEachFadd( vFadds, i )
        Vec_IntWriteEntry( vMap, Vec_IntEntry(vFadds, 5*i+4), i );
    return vMap;
}